

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewDelimiter(LocationUpdater *this,BinaryLocation oldAddr)

{
  const_iterator cVar1;
  const_iterator cVar2;
  uint *puVar3;
  BinaryLocation BVar4;
  key_type local_28;
  size_t local_20;
  
  local_28 = (key_type)CONCAT44(local_28._4_4_,oldAddr);
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->oldExprAddrMap).delimiterMap._M_h,(key_type *)&local_28);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    BVar4 = 0;
  }
  else {
    local_28 = *(key_type *)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_false>
                       ._M_cur + 0x10);
    local_20 = *(size_t *)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_false>
                       ._M_cur + 0x18);
    BVar4 = 0;
    if (local_28 != (key_type)0x0) {
      cVar2 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->newLocations->delimiters)._M_h,&local_28);
      BVar4 = 0;
      if (cVar2.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        puVar3 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                           ((ZeroInitSmallVector<unsigned_int,_1UL> *)
                            ((long)cVar2.
                                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                                   ._M_cur + 0x10),local_20);
        BVar4 = *puVar3;
      }
    }
  }
  return BVar4;
}

Assistant:

BinaryLocation getNewDelimiter(BinaryLocation oldAddr) const {
    auto info = oldExprAddrMap.getDelimiter(oldAddr);
    if (info.expr) {
      auto iter = newLocations.delimiters.find(info.expr);
      if (iter != newLocations.delimiters.end()) {
        return iter->second[info.id];
      }
    }
    return 0;
  }